

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShaperTest.cpp
# Opt level: O2

int testSimpleNNShapeBad(void)

{
  ResultType RVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  NeuralNetwork *pNVar6;
  NeuralNetworkLayer *this;
  InnerProductLayerParams *this_00;
  WeightParams *this_01;
  ostream *poVar7;
  int iVar8;
  char *pcVar9;
  bool bVar10;
  Result res;
  Model m1;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"output");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  pNVar6 = CoreML::Specification::Model::mutable_neuralnetwork(&m1);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar6->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"output");
  this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(this);
  this_00->inputchannels_ = 4;
  this_00->outputchannels_ = 3;
  iVar8 = 0xc;
  while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
    this_01 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_00);
    CoreML::Specification::WeightParams::add_floatvalue(this_01,1.0);
  }
  this_00->hasbias_ = false;
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar10 = CoreML::Result::good(&res);
  if (bVar10) {
    RVar1 = CoreML::Result::type(&res);
    iVar8 = 0;
    if (RVar1 == POTENTIALLY_INVALID_NEURAL_NETWORK_SHAPES) goto LAB_001381b2;
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x5a);
    poVar7 = std::operator<<(poVar7,": error: ");
    pcVar9 = "res.type() == ResultType::POTENTIALLY_INVALID_NEURAL_NETWORK_SHAPES";
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x59);
    poVar7 = std::operator<<(poVar7,": error: ");
    pcVar9 = "(res).good()";
  }
  poVar7 = std::operator<<(poVar7,pcVar9);
  poVar7 = std::operator<<(poVar7," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar7);
  iVar8 = 1;
LAB_001381b2:
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return iVar8;
}

Assistant:

int testSimpleNNShapeBad() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(3);

    auto *nn = m1.mutable_neuralnetwork();

    // The parameters of the layer don't match the network inputs & outputs
    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("output");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(4);
    innerProductParams->set_outputchannels(3);
    for (int i = 0; i < 12; i++) {
        innerProductParams->mutable_weights()->add_floatvalue(1.0);
    }

    innerProductParams->set_hasbias(false);

    // This is not valid from the perspective of the shapes in the network, but that is being raised as
    // a warning instead of being an invalid model.
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    ML_ASSERT(res.type() == ResultType::POTENTIALLY_INVALID_NEURAL_NETWORK_SHAPES);

    return 0;

}